

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_set.cpp
# Opt level: O1

BoundStatement * __thiscall
duckdb::Binder::Bind
          (BoundStatement *__return_storage_ptr__,Binder *this,ResetVariableStatement *stmt)

{
  pointer pLVar1;
  SetScope SVar2;
  pointer pcVar3;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var4;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> this_00
  ;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *pvVar5;
  StatementProperties *pSVar6;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_89;
  undefined1 local_88 [32];
  LogicalType local_68;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_68,BOOLEAN);
  __l._M_len = 1;
  __l._M_array = &local_68;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,__l,&local_89);
  local_88._0_8_ =
       (__return_storage_ptr__->types).
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_88._8_8_ =
       (__return_storage_ptr__->types).
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_88._16_8_ =
       (__return_storage_ptr__->types).
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_88);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  LogicalType::~LogicalType(&local_68);
  pLVar1 = (pointer)(local_88 + 0x10);
  local_88._0_8_ = pLVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Success","");
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_88;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_68,__l_00,(allocator_type *)&local_89);
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(__return_storage_ptr__->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(__return_storage_ptr__->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(__return_storage_ptr__->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_68._0_8_;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_68.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_68.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_68.id_ = INVALID;
  local_68.physical_type_ = ~INVALID;
  local_68._2_6_ = 0;
  local_68.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_68.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  if ((pointer)local_88._0_8_ != pLVar1) {
    operator_delete((void *)local_88._0_8_);
  }
  this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)operator_new(0x90);
  pcVar3 = (stmt->super_SetStatement).name._M_dataplus._M_p;
  local_88._0_8_ = pLVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar3,pcVar3 + (stmt->super_SetStatement).name._M_string_length);
  SVar2 = (stmt->super_SetStatement).scope;
  LogicalOperator::LogicalOperator
            ((LogicalOperator *)
             this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
             LOGICAL_RESET);
  *(undefined ***)this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       &PTR__LogicalReset_024ac660;
  pvVar5 = &((LogicalOperator *)
            ((long)this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl +
            0x68))->children;
  ((LogicalOperator *)
  ((long)this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 0x68))->
  _vptr_LogicalOperator = (_func_int **)pvVar5;
  if ((pointer)local_88._0_8_ == pLVar1) {
    *(undefined4 *)
     &(pvVar5->
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_88._16_4_;
    *(undefined4 *)
     ((long)&(((LogicalOperator *)
              ((long)this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl +
              0x68))->children).
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = local_88._20_4_;
    *(undefined4 *)
     &(((LogicalOperator *)
       ((long)this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 0x68))
      ->children).
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_88._24_4_;
    *(undefined4 *)
     ((long)&(((LogicalOperator *)
              ((long)this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl +
              0x68))->children).
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = local_88._28_4_;
  }
  else {
    ((LogicalOperator *)
    ((long)this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 0x68))->
    _vptr_LogicalOperator = (_func_int **)local_88._0_8_;
    (((LogicalOperator *)
     ((long)this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 0x68))->
    children).
    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._16_8_;
  }
  *(undefined8 *)
   &((LogicalOperator *)
    ((long)this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 0x68))->
    type = local_88._8_8_;
  local_88._8_8_ = (pointer)0x0;
  local_88._16_8_ = local_88._16_8_ & 0xffffffffffffff00;
  *(SetScope *)
   &(((LogicalOperator *)
     ((long)this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl + 0x68))->
    children).
    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = SVar2;
  _Var4.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (__return_storage_ptr__->plan).
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       this_00.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_88._0_8_ = pLVar1;
  if (_Var4.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    (**(code **)(*(long *)_Var4.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                + 8))();
  }
  pSVar6 = GetStatementProperties(this);
  pSVar6->return_type = NOTHING;
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::Bind(ResetVariableStatement &stmt) {
	BoundStatement result;
	result.types = {LogicalType::BOOLEAN};
	result.names = {"Success"};

	result.plan = make_uniq<LogicalReset>(stmt.name, stmt.scope);

	auto &properties = GetStatementProperties();
	properties.return_type = StatementReturnType::NOTHING;
	return result;
}